

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::InternalSwap
          (LayerNormalizationLayerParams *this,LayerNormalizationLayerParams *other)

{
  LayerNormalizationLayerParams *other_local;
  LayerNormalizationLayerParams *this_local;
  
  google::protobuf::RepeatedField<long>::InternalSwap
            (&this->normalizedshape_,&other->normalizedshape_);
  std::swap<CoreML::Specification::WeightParams*>(&this->gamma_,&other->gamma_);
  std::swap<CoreML::Specification::WeightParams*>(&this->beta_,&other->beta_);
  std::swap<float>(&this->eps_,&other->eps_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void LayerNormalizationLayerParams::InternalSwap(LayerNormalizationLayerParams* other) {
  normalizedshape_.InternalSwap(&other->normalizedshape_);
  std::swap(gamma_, other->gamma_);
  std::swap(beta_, other->beta_);
  std::swap(eps_, other->eps_);
  std::swap(_cached_size_, other->_cached_size_);
}